

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddSymbol
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *name,
          FileDescriptorProto *value)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>_>
  *this_00;
  byte bVar1;
  pointer pcVar2;
  size_t size;
  _Base_ptr size_00;
  StringPiece sub_symbol;
  StringPiece SVar3;
  bool bVar4;
  size_t sVar5;
  const_iterator cVar6;
  LogMessage *pLVar7;
  const_iterator __position;
  char *pcVar8;
  _Rb_tree_header *p_Var9;
  StringPiece sub_symbol_00;
  _Alloc_node __an;
  _Alloc_node local_88;
  int *local_80 [2];
  int local_70 [4];
  FileDescriptorProto *local_60;
  char *local_48;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
  *local_40;
  FileDescriptorProto *local_38;
  
  pcVar2 = (name->_M_dataplus)._M_p;
  size = name->_M_string_length;
  if ((long)size < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
LAB_00386747:
    sVar5 = 0;
    do {
      bVar1 = pcVar2[sVar5];
      if ((((bVar1 != 0x2e) && (bVar1 != 0x5f)) && ((byte)(bVar1 - 0x3a) < 0xf6)) &&
         ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_80,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0xcc);
        pLVar7 = internal::LogMessage::operator<<((LogMessage *)local_80,"Invalid symbol name: ");
        pLVar7 = internal::LogMessage::operator<<(pLVar7,name);
        internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar7);
        goto LAB_003869d5;
      }
      sVar5 = sVar5 + 1;
    } while (size != sVar5);
  }
  else if (size != 0) goto LAB_00386747;
  this_00 = &this->by_symbol_;
  cVar6 = (anonymous_namespace)::
          FindLastLessOrEqual<std::map<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>,std::__cxx11::string>
                    (this_00,name);
  p_Var9 = &(this->by_symbol_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar6._M_node == p_Var9) {
    local_80[0] = &((LogMessage *)local_80)->line_;
    pcVar2 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar2,pcVar2 + name->_M_string_length);
    local_60 = value;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
    ::
    _M_insert_unique<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
                *)this_00,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
                *)local_80);
  }
  else {
    pcVar8 = *(char **)(cVar6._M_node + 1);
    size_00 = cVar6._M_node[1]._M_parent;
    local_40 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
                *)this_00;
    local_38 = value;
    if ((long)size_00 < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                ((size_t)size_00,"string length exceeds max size");
    }
    SVar3.ptr_ = (name->_M_dataplus)._M_p;
    SVar3.length_ = name->_M_string_length;
    if ((long)name->_M_string_length < 0) {
      local_48 = pcVar8;
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (name->_M_string_length,"string length exceeds max size");
      pcVar8 = local_48;
    }
    sub_symbol_00.length_ = (size_type)size_00;
    sub_symbol_00.ptr_ = pcVar8;
    bVar4 = anon_unknown_31::IsSubSymbol(sub_symbol_00,SVar3);
    if (bVar4) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_80,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                 ,0xdc);
      pLVar7 = internal::LogMessage::operator<<((LogMessage *)local_80,"Symbol name \"");
      pLVar7 = internal::LogMessage::operator<<(pLVar7,name);
      pLVar7 = internal::LogMessage::operator<<(pLVar7,"\" conflicts with the existing symbol \"");
      pLVar7 = internal::LogMessage::operator<<(pLVar7,(string *)(cVar6._M_node + 1));
      pLVar7 = internal::LogMessage::operator<<(pLVar7,"\".");
      internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar7);
LAB_003869d5:
      internal::LogMessage::~LogMessage((LogMessage *)local_80);
      return false;
    }
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node);
    if ((_Rb_tree_header *)__position._M_node != p_Var9) {
      sub_symbol.ptr_ = (name->_M_dataplus)._M_p;
      sub_symbol.length_ = name->_M_string_length;
      if ((long)name->_M_string_length < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (name->_M_string_length,"string length exceeds max size");
      }
      SVar3 = *(StringPiece *)(__position._M_node + 1);
      if ((long)__position._M_node[1]._M_parent < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  ((size_t)__position._M_node[1]._M_parent,"string length exceeds max size");
      }
      bVar4 = anon_unknown_31::IsSubSymbol(sub_symbol,SVar3);
      if (bVar4) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_80,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0xeb);
        pLVar7 = internal::LogMessage::operator<<((LogMessage *)local_80,"Symbol name \"");
        pLVar7 = internal::LogMessage::operator<<(pLVar7,name);
        pLVar7 = internal::LogMessage::operator<<(pLVar7,"\" conflicts with the existing symbol \"")
        ;
        pLVar7 = internal::LogMessage::operator<<(pLVar7,(string *)(__position._M_node + 1));
        pLVar7 = internal::LogMessage::operator<<(pLVar7,"\".");
        internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar7);
        goto LAB_003869d5;
      }
    }
    local_80[0] = &((LogMessage *)local_80)->line_;
    pcVar2 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar2,pcVar2 + name->_M_string_length);
    local_60 = local_38;
    local_88._M_t =
         (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>_>
          *)local_40;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
    ::
    _M_insert_unique_<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>::_Alloc_node>
              (local_40,__position,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
                *)local_80,&local_88);
  }
  if (local_80[0] != &((LogMessage *)local_80)->line_) {
    operator_delete(local_80[0]);
  }
  return true;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddSymbol(
    const std::string& name, Value value) {
  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(name)) {
    GOOGLE_LOG(ERROR) << "Invalid symbol name: " << name;
    return false;
  }

  // Try to look up the symbol to make sure a super-symbol doesn't already
  // exist.
  auto iter = FindLastLessOrEqual(&by_symbol_, name);

  if (iter == by_symbol_.end()) {
    // Apparently the map is currently empty.  Just insert and be done with it.
    by_symbol_.insert(
        typename std::map<std::string, Value>::value_type(name, value));
    return true;
  }

  if (IsSubSymbol(iter->first, name)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name
               << "\" conflicts with the existing "
                  "symbol \""
               << iter->first << "\".";
    return false;
  }

  // OK, that worked.  Now we have to make sure that no symbol in the map is
  // a sub-symbol of the one we are inserting.  The only symbol which could
  // be so is the first symbol that is greater than the new symbol.  Since
  // |iter| points at the last symbol that is less than or equal, we just have
  // to increment it.
  ++iter;

  if (iter != by_symbol_.end() && IsSubSymbol(name, iter->first)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name
               << "\" conflicts with the existing "
                  "symbol \""
               << iter->first << "\".";
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(
      iter, typename std::map<std::string, Value>::value_type(name, value));

  return true;
}